

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void sat_solver_reducedb(sat_solver *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  uint nSize;
  int iVar3;
  int *piVar4;
  int iVar5;
  abctime aVar6;
  int *pCosts;
  clause *pcVar7;
  int *__ptr;
  ulong uVar8;
  long lVar9;
  abctime aVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint k;
  clause cVar15;
  veci *pvVar16;
  Sat_Mem_t *p;
  uint k_00;
  double dVar17;
  
  aVar6 = Abc_Clock();
  if (s->nLearntMax < 1) {
    __assert_fail("s->nLearntMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x5fc,"void sat_solver_reducedb(sat_solver *)");
  }
  nSize = (s->act_clas).size;
  if (nSize != (s->Mem).nEntries[1]) {
    __assert_fail("nLearnedOld == Sat_MemEntryNum(pMem, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x5fd,"void sat_solver_reducedb(sat_solver *)");
  }
  if (nSize != (s->stats).learnts) {
    __assert_fail("nLearnedOld == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x5fe,"void sat_solver_reducedb(sat_solver *)");
  }
  p = &s->Mem;
  piVar4 = (s->act_clas).ptr;
  iVar5 = s->nDBreduces + 1;
  s->nDBreduces = iVar5;
  s->nLearntMax = iVar5 * s->nLearntDelta + s->nLearntStart;
  pCosts = (int *)malloc((long)(int)nSize * 4);
  lVar14 = 1;
  do {
    if ((s->Mem).iPage[1] < lVar14) {
      iVar5 = s->nLearntMax;
      iVar3 = s->nLearntRatio;
      __ptr = Abc_MergeSortCost(pCosts,nSize);
      if (pCosts[__ptr[(long)(int)nSize + -1]] < pCosts[*__ptr]) {
        __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x61b,"void sat_solver_reducedb(sat_solver *)");
      }
      iVar3 = pCosts[__ptr[(int)((int)(iVar3 * nSize) / -100 + nSize)]];
      free(__ptr);
      k_00 = 0;
      lVar14 = 1;
      uVar11 = 0;
      do {
        if ((s->Mem).iPage[1] < lVar14) {
          if ((s->stats).learnts != k_00) {
            __assert_fail("s->stats.learnts == (unsigned)j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x62e,"void sat_solver_reducedb(sat_solver *)");
          }
          if (uVar11 != nSize) {
            __assert_fail("Counter == nLearnedOld",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x62f,"void sat_solver_reducedb(sat_solver *)");
          }
          veci_resize(&s->act_clas,k_00);
          free(pCosts);
          uVar11 = Sat_MemCompactLearned(p,0);
          if (uVar11 != (s->stats).learnts) {
            __assert_fail("Counter == (int)s->stats.learnts",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x635,"void sat_solver_reducedb(sat_solver *)");
          }
          for (lVar14 = 0; uVar8 = (ulong)s->size, lVar14 < (long)uVar8; lVar14 = lVar14 + 1) {
            uVar11 = s->reasons[lVar14];
            if (((uVar11 & 1) == 0 && uVar11 != 0) && (((s->Mem).uLearnedMask & uVar11) != 0)) {
              pcVar7 = Sat_MemClauseHand(p,uVar11);
              if (((uint)*pcVar7 & 2) != 0) {
                __assert_fail("c->mark == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                              ,0x641,"void sat_solver_reducedb(sat_solver *)");
              }
              *(clause *)(s->reasons + lVar14) = pcVar7[(ulong)((uint)*pcVar7 >> 0xb) + 1];
            }
          }
          lVar14 = 0;
          do {
            if ((int)uVar8 * 2 <= lVar14) {
              uVar11 = Sat_MemCompactLearned(p,1);
              iVar5 = (int)p;
              if (uVar11 != (s->stats).learnts) {
                __assert_fail("Counter == (int)s->stats.learnts",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                              ,0x65b,"void sat_solver_reducedb(sat_solver *)");
              }
              aVar10 = Abc_Clock();
              sat_solver_reducedb::TimeTotal = sat_solver_reducedb::TimeTotal + (aVar10 - aVar6);
              if (s->fVerbose != 0) {
                Abc_Print(iVar5,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
                          ((double)(s->stats).learnts * 100.0) / (double)(int)nSize);
                dVar17 = (double)sat_solver_reducedb::TimeTotal;
                Abc_Print(iVar5,"%s =","Time");
                Abc_Print(iVar5,"%9.2f sec\n",dVar17 / 1000000.0);
                return;
              }
              return;
            }
            pvVar16 = s->wlists;
            piVar4 = pvVar16[lVar14].ptr;
            iVar5 = 0;
            for (lVar13 = 0; lVar13 < pvVar16[lVar14].size; lVar13 = lVar13 + 1) {
              cVar15 = *(clause *)(piVar4 + lVar13);
              if ((((uint)cVar15 & 1) == 0) && (((s->Mem).uLearnedMask & (uint)cVar15) != 0)) {
                pcVar7 = Sat_MemClauseHand(p,(cla)cVar15);
                if (((uint)*pcVar7 & 2) == 0) {
                  cVar15 = pcVar7[(ulong)((uint)*pcVar7 >> 0xb) + 1];
                  goto LAB_004629c3;
                }
              }
              else {
LAB_004629c3:
                lVar9 = (long)iVar5;
                iVar5 = iVar5 + 1;
                *(clause *)(piVar4 + lVar9) = cVar15;
              }
              pvVar16 = s->wlists;
            }
            veci_resize(pvVar16 + lVar14,iVar5);
            lVar14 = lVar14 + 1;
            uVar8 = (ulong)(uint)s->size;
          } while( true );
        }
        for (k = 2; (int)k < *(s->Mem).pPages[lVar14];
            k = k + (((uint)*pcVar7 & 1) + ((uint)*pcVar7 >> 0xb) + 2 & 0xfffffffe)) {
          pcVar7 = Sat_MemClause(p,(int)lVar14,k);
          if (pcVar7 == (clause *)0x0) break;
          cVar15 = *pcVar7;
          if (((uint)cVar15 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x624,"void sat_solver_reducedb(sat_solver *)");
          }
          uVar12 = (uint)cVar15 >> 0xb;
          if (((((int)(iVar5 / -0x14 + nSize) < (int)uVar11) || ((uint)cVar15 < 0x1800)) ||
              (iVar3 < pCosts[(int)pcVar7[(ulong)uVar12 + 1]])) ||
             (s->reasons[(int)pcVar7[1] >> 1] ==
              ((int)lVar14 << ((byte)(s->Mem).nPageSize & 0x1f) | k))) {
            lVar13 = (long)(int)k_00;
            k_00 = k_00 + 1;
            piVar4[lVar13] = piVar4[(int)pcVar7[(ulong)uVar12 + 1]];
          }
          else {
            *pcVar7 = (clause)((uint)cVar15 | 2);
            pAVar1 = &(s->stats).learnts_literals;
            *pAVar1 = *pAVar1 - (ulong)uVar12;
            puVar2 = &(s->stats).learnts;
            *puVar2 = *puVar2 - 1;
          }
          uVar11 = uVar11 + 1;
        }
        lVar14 = lVar14 + 2;
      } while( true );
    }
    for (iVar5 = 2; iVar5 < *(s->Mem).pPages[lVar14];
        iVar5 = iVar5 + (((uint)*pcVar7 & 1) + ((uint)*pcVar7 >> 0xb) + 2 & 0xfffffffe)) {
      pcVar7 = Sat_MemClause(p,(int)lVar14,iVar5);
      if (pcVar7 == (clause *)0x0) break;
      cVar15 = pcVar7[(ulong)((uint)*pcVar7 >> 0xb) + 1];
      uVar11 = (uint)*pcVar7 >> 3 & 0xff;
      if (6 < uVar11) {
        uVar11 = 7;
      }
      uVar11 = (uVar11 ^ 7) << 0x1c;
      if (s->ClaActType == 0) {
        iVar3 = piVar4[(int)cVar15];
        pCosts[(int)cVar15] = uVar11 | iVar3 >> 4;
        if (iVar3 >> 4 < 0) {
          __assert_fail("pSortValues[Id] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                        ,0x610,"void sat_solver_reducedb(sat_solver *)");
        }
      }
      else {
        pCosts[(int)cVar15] = uVar11;
      }
    }
    lVar14 = lVar14 + 2;
  } while( true );
}

Assistant:

void sat_solver_reducedb(sat_solver* s)
{
    static abctime TimeTotal = 0;
    abctime clk = Abc_Clock();
    Sat_Mem_t * pMem = &s->Mem;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pArray, * pSortValues, nCutoffValue;
    int i, k, j, Id, Counter, CounterStart, nSelected;
    clause * c;

    assert( s->nLearntMax > 0 );
    assert( nLearnedOld == Sat_MemEntryNum(pMem, 1) );
    assert( nLearnedOld == (int)s->stats.learnts );

    s->nDBreduces++;

    //printf( "Calling reduceDB with %d learned clause limit.\n", s->nLearntMax );
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
//    return;

    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
//        pSortValues[Id] = act[Id];
        if ( s->ClaActType == 0 )
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4);
        else
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28);// | (act_clas[Id] >> 4);
        assert( pSortValues[Id] >= 0 );
    }

    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);

    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;

    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    ActCutOff = ABC_INFINITY;

    // mark learned clauses to remove
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 3 || pSortValues[clause_id(c)] > nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
            act_clas[j++] = act_clas[clause_id(c)];
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    ABC_FREE( pSortValues );

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        c = clause_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                c = clause_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
    Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
        s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
    Abc_PrintTime( 1, "Time", TimeTotal );
    }
}